

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O0

void avro::codec_traits<uau::_union_array_union_Union__1__>::decode
               (Decoder *d,_union_array_union_Union__1__ *v)

{
  _union_array_union_Union__1__ *this;
  undefined8 uVar1;
  long *in_RDI;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_> vv
  ;
  size_t n;
  string *in_stack_ffffffffffffff78;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_> *t
  ;
  Exception *in_stack_ffffffffffffff80;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *in_stack_ffffffffffffff90;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  local_68;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  this = (_union_array_union_Union__1__ *)(**(code **)(*in_RDI + 0xb0))();
  if (this < (_union_array_union_Union__1__ *)0x2) {
    if (this == (_union_array_union_Union__1__ *)0x0) {
      (**(code **)(*in_RDI + 0x18))();
      uau::_union_array_union_Union__1__::set_null(this);
    }
    else if (this == (_union_array_union_Union__1__ *)0x1) {
      t = &local_68;
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::vector((vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                *)0x2cd8c4);
      decode<std::vector<uau::_union_array_union_Union__0__,std::allocator<uau::_union_array_union_Union__0__>>>
                ((Decoder *)this,t);
      uau::_union_array_union_Union__1__::set_array(this,t);
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::~vector(in_stack_ffffffffffffff90);
    }
    return;
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  uVar1 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  Exception::Exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                std::vector<uau::_union_array_union_Union__0__ > vv;
                avro::decode(d, vv);
                v.set_array(vv);
            }
            break;
        }
    }